

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.h
# Opt level: O2

void __thiscall Assimp::RAWImporter::MeshInformation::~MeshInformation(MeshInformation *this)

{
  std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
            (&(this->colors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->vertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit MeshInformation(const std::string& _name)
            : name(_name)
        {
            vertices.reserve(100);
            colors.reserve(100);
        }